

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

attack * attacktype_fordmg(permonst *ptr,int atyp,int dtyp)

{
  attack *local_28;
  attack *a;
  int dtyp_local;
  int atyp_local;
  permonst *ptr_local;
  
  local_28 = ptr->mattk;
  while( true ) {
    if (&ptr->cwt <= local_28) {
      return (attack *)0x0;
    }
    if (((uint)local_28->aatyp == atyp) && ((dtyp == -1 || ((uint)local_28->adtyp == dtyp)))) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

const struct attack *attacktype_fordmg(const struct permonst *ptr, int atyp, int dtyp)
{
    const struct attack *a;

    for (a = &ptr->mattk[0]; a < &ptr->mattk[NATTK]; a++)
	if (a->aatyp == atyp && (dtyp == AD_ANY || a->adtyp == dtyp))
	    return a;

    return NULL;
}